

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O0

Modifier Corrade::Utility::Debug::boldColor(Color color)

{
  ostream *output;
  Flags local_41;
  Error local_40;
  Color local_11;
  Modifier p_Stack_10;
  Color color_local;
  
  local_11 = color;
  switch(color) {
  case Black:
    p_Stack_10 = __Corrade__Utility__Debug__colorInternal<(Corrade::Utility::Debug::Color)0,true>___
                           ();
    break;
  case Red:
    p_Stack_10 = __Corrade__Utility__Debug__colorInternal<(Corrade::Utility::Debug::Color)1,true>___
                           ();
    break;
  case Green:
    p_Stack_10 = __Corrade__Utility__Debug__colorInternal<(Corrade::Utility::Debug::Color)2,true>___
                           ();
    break;
  case Yellow:
    p_Stack_10 = __Corrade__Utility__Debug__colorInternal<(Corrade::Utility::Debug::Color)3,true>___
                           ();
    break;
  case Blue:
    p_Stack_10 = __Corrade__Utility__Debug__colorInternal<(Corrade::Utility::Debug::Color)4,true>___
                           ();
    break;
  case Magenta:
    p_Stack_10 = __Corrade__Utility__Debug__colorInternal<(Corrade::Utility::Debug::Color)5,true>___
                           ();
    break;
  case Cyan:
    p_Stack_10 = __Corrade__Utility__Debug__colorInternal<(Corrade::Utility::Debug::Color)6,true>___
                           ();
    break;
  case White:
    p_Stack_10 = __Corrade__Utility__Debug__colorInternal<(Corrade::Utility::Debug::Color)7,true>___
                           ();
    break;
  default:
    output = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_41);
    Error::Error(&local_40,output,local_41);
    operator<<(&local_40.super_Debug,
               "Reached unreachable code at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Debug.cpp:467"
              );
    Error::~Error(&local_40);
    abort();
  case Default:
    p_Stack_10 = __Corrade__Utility__Debug__colorInternal<(Corrade::Utility::Debug::Color)9,true>___
                           ();
  }
  return p_Stack_10;
}

Assistant:

auto Debug::boldColor(Color color) -> Modifier {
    /* Crazy but working solution to work around the need for capturing lambda
       which disallows converting it to function pointer */
    switch(color) {
        #define _c(color) case Color::color: return colorInternal<Color::color, true>();
        _c(Black)
        _c(Red)
        _c(Green)
        _c(Yellow)
        _c(Blue)
        _c(Magenta)
        _c(Cyan)
        _c(White)
        #if !defined(CORRADE_TARGET_WINDOWS) || defined(CORRADE_UTILITY_USE_ANSI_COLORS)
        _c(Default)
        #endif
        #undef _c
    }

    CORRADE_INTERNAL_ASSERT_UNREACHABLE(); /* LCOV_EXCL_LINE */
}